

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_MACRO_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  if (val == 1) {
    *s_out = "DW_MACRO_define";
    s_out_local._4_4_ = 0;
  }
  else if (val == 2) {
    *s_out = "DW_MACRO_undef";
    s_out_local._4_4_ = 0;
  }
  else if (val == 3) {
    *s_out = "DW_MACRO_start_file";
    s_out_local._4_4_ = 0;
  }
  else if (val == 4) {
    *s_out = "DW_MACRO_end_file";
    s_out_local._4_4_ = 0;
  }
  else if (val == 5) {
    *s_out = "DW_MACRO_define_strp";
    s_out_local._4_4_ = 0;
  }
  else if (val == 6) {
    *s_out = "DW_MACRO_undef_strp";
    s_out_local._4_4_ = 0;
  }
  else if (val == 7) {
    *s_out = "DW_MACRO_import";
    s_out_local._4_4_ = 0;
  }
  else if (val == 8) {
    *s_out = "DW_MACRO_define_sup";
    s_out_local._4_4_ = 0;
  }
  else if (val == 9) {
    *s_out = "DW_MACRO_undef_sup";
    s_out_local._4_4_ = 0;
  }
  else if (val == 10) {
    *s_out = "DW_MACRO_import_sup";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xb) {
    *s_out = "DW_MACRO_define_strx";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xc) {
    *s_out = "DW_MACRO_undef_strx";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xe0) {
    *s_out = "DW_MACRO_lo_user";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xff) {
    *s_out = "DW_MACRO_hi_user";
    s_out_local._4_4_ = 0;
  }
  else {
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_MACRO_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_MACRO_define:
        *s_out = "DW_MACRO_define";
        return DW_DLV_OK;
    case DW_MACRO_undef:
        *s_out = "DW_MACRO_undef";
        return DW_DLV_OK;
    case DW_MACRO_start_file:
        *s_out = "DW_MACRO_start_file";
        return DW_DLV_OK;
    case DW_MACRO_end_file:
        *s_out = "DW_MACRO_end_file";
        return DW_DLV_OK;
    case DW_MACRO_define_strp:
        *s_out = "DW_MACRO_define_strp";
        return DW_DLV_OK;
    case DW_MACRO_undef_strp:
        *s_out = "DW_MACRO_undef_strp";
        return DW_DLV_OK;
    case DW_MACRO_import:
        *s_out = "DW_MACRO_import";
        return DW_DLV_OK;
    case DW_MACRO_define_sup:
        *s_out = "DW_MACRO_define_sup";
        return DW_DLV_OK;
    case DW_MACRO_undef_sup:
        *s_out = "DW_MACRO_undef_sup";
        return DW_DLV_OK;
    case DW_MACRO_import_sup:
        *s_out = "DW_MACRO_import_sup";
        return DW_DLV_OK;
    case DW_MACRO_define_strx:
        *s_out = "DW_MACRO_define_strx";
        return DW_DLV_OK;
    case DW_MACRO_undef_strx:
        *s_out = "DW_MACRO_undef_strx";
        return DW_DLV_OK;
    case DW_MACRO_lo_user:
        *s_out = "DW_MACRO_lo_user";
        return DW_DLV_OK;
    case DW_MACRO_hi_user:
        *s_out = "DW_MACRO_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}